

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
* TasGrid::IO::getStringRuleMap_abi_cxx11_(void)

{
  long lVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  *in_RDI;
  long *plVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  __l;
  allocator_type local_6da;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_6d9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_6d8;
  undefined1 *local_6b0 [2];
  undefined1 local_6a0 [16];
  undefined4 local_690;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined4 local_668;
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined4 local_640;
  undefined1 *local_638 [2];
  undefined1 local_628 [16];
  undefined4 local_618;
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined4 local_5f0;
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined4 local_5c8;
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined4 local_5a0;
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  undefined4 local_578;
  undefined1 *local_570 [2];
  undefined1 local_560 [16];
  undefined4 local_550;
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined4 local_528;
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined4 local_500;
  undefined1 *local_4f8 [2];
  undefined1 local_4e8 [16];
  undefined4 local_4d8;
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  undefined4 local_4b0;
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined4 local_488;
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined4 local_460;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined4 local_438;
  undefined1 *local_430 [2];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined4 local_3e8;
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined4 local_3c0;
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  undefined4 local_398;
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  undefined4 local_370;
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined4 local_348;
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined4 local_320;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined4 local_2f8;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined4 local_2d0;
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined4 local_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined4 local_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined4 local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined4 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  undefined4 local_28;
  
  local_6d8.first._M_dataplus._M_p = (pointer)&local_6d8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"none","");
  local_6d8.second = rule_none;
  local_6b0[0] = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"clenshaw-curtis","");
  local_690 = 1;
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"clenshaw-curtis-zero","");
  local_668 = 2;
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"chebyshev","");
  local_640 = 4;
  local_638[0] = local_628;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"chebyshev-odd","");
  local_618 = 5;
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"gauss-legendre","");
  local_5f0 = 0x15;
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"gauss-legendre-odd","");
  local_5c8 = 0x16;
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"gauss-patterson","");
  local_5a0 = 0x17;
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"leja","");
  local_578 = 6;
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"leja-odd","");
  local_550 = 7;
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"rleja","");
  local_528 = 8;
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"rleja-double2","");
  local_500 = 9;
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"rleja-double4","");
  local_4d8 = 10;
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"rleja-odd","");
  local_4b0 = 0xb;
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"rleja-shifted","");
  local_488 = 0xc;
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"rleja-shifted-even","");
  local_460 = 0xd;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"rleja-shifted-double","");
  local_438 = 0xe;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"max-lebesgue","");
  local_410 = 0xf;
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"max-lebesgue-odd","");
  local_3e8 = 0x10;
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"min-lebesgue","");
  local_3c0 = 0x11;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"min-lebesgue-odd","");
  local_398 = 0x12;
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"min-delta","");
  local_370 = 0x13;
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"min-delta-odd","");
  local_348 = 0x14;
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"gauss-chebyshev1","");
  local_320 = 0x18;
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"gauss-chebyshev1-odd","");
  local_2f8 = 0x19;
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"gauss-chebyshev2","");
  local_2d0 = 0x1a;
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"gauss-chebyshev2-odd","");
  local_2a8 = 0x1b;
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"fejer2","");
  local_280 = 3;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"gauss-gegenbauer","");
  local_258 = 0x1c;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"gauss-gegenbauer-odd","");
  local_230 = 0x1d;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"gauss-jacobi","");
  local_208 = 0x1e;
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"gauss-jacobi-odd","");
  local_1e0 = 0x1f;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"gauss-laguerre","");
  local_1b8 = 0x20;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"gauss-laguerre-odd","");
  local_190 = 0x21;
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"gauss-hermite","");
  local_168 = 0x22;
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"gauss-hermite-odd","");
  local_140 = 0x23;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"custom-tabulated","");
  local_118 = 0x24;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"localp","");
  local_f0 = 0x25;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"localp-zero","");
  local_c8 = 0x26;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"localp-boundary","");
  local_a0 = 0x28;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"semi-localp","");
  local_78 = 0x27;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"wavelet","");
  local_50 = 0x29;
  plVar2 = local_38;
  local_48[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"fourier","");
  local_28 = 0x2a;
  __l._M_len = 0x2b;
  __l._M_array = &local_6d8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  ::map(in_RDI,__l,&local_6d9,&local_6da);
  lVar1 = -0x6b8;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeOneDRule> getStringRuleMap(){
    return std::initializer_list<std::pair<std::string const, TypeOneDRule>>{
        {"none",                 rule_none},
        {"clenshaw-curtis",      rule_clenshawcurtis},
        {"clenshaw-curtis-zero", rule_clenshawcurtis0},
        {"chebyshev",            rule_chebyshev},
        {"chebyshev-odd",        rule_chebyshevodd},
        {"gauss-legendre",       rule_gausslegendre},
        {"gauss-legendre-odd",   rule_gausslegendreodd},
        {"gauss-patterson",      rule_gausspatterson},
        {"leja",                 rule_leja},
        {"leja-odd",             rule_lejaodd},
        {"rleja",                rule_rleja},
        {"rleja-double2",        rule_rlejadouble2},
        {"rleja-double4",        rule_rlejadouble4},
        {"rleja-odd",            rule_rlejaodd},
        {"rleja-shifted",        rule_rlejashifted},
        {"rleja-shifted-even",   rule_rlejashiftedeven},
        {"rleja-shifted-double", rule_rlejashifteddouble},
        {"max-lebesgue",         rule_maxlebesgue},
        {"max-lebesgue-odd",     rule_maxlebesgueodd},
        {"min-lebesgue",         rule_minlebesgue},
        {"min-lebesgue-odd",     rule_minlebesgueodd},
        {"min-delta",            rule_mindelta},
        {"min-delta-odd",        rule_mindeltaodd},
        {"gauss-chebyshev1",     rule_gausschebyshev1},
        {"gauss-chebyshev1-odd", rule_gausschebyshev1odd},
        {"gauss-chebyshev2",     rule_gausschebyshev2},
        {"gauss-chebyshev2-odd", rule_gausschebyshev2odd},
        {"fejer2",               rule_fejer2},
        {"gauss-gegenbauer",     rule_gaussgegenbauer},
        {"gauss-gegenbauer-odd", rule_gaussgegenbauerodd},
        {"gauss-jacobi",         rule_gaussjacobi},
        {"gauss-jacobi-odd",     rule_gaussjacobiodd},
        {"gauss-laguerre",       rule_gausslaguerre},
        {"gauss-laguerre-odd",   rule_gausslaguerreodd},
        {"gauss-hermite",        rule_gausshermite},
        {"gauss-hermite-odd",    rule_gausshermiteodd},
        {"custom-tabulated",     rule_customtabulated},
        {"localp",               rule_localp},
        {"localp-zero",          rule_localp0},
        {"localp-boundary",      rule_localpb},
        {"semi-localp",          rule_semilocalp},
        {"wavelet",              rule_wavelet},
        {"fourier",              rule_fourier}};
}